

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O2

Id __thiscall
spv::Builder::makeCooperativeMatrixTypeKHR
          (Builder *this,Id component,Id scope,Id rows,Id cols,Id use)

{
  unordered_map<unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>_>
  *this_00;
  Builder *pBVar1;
  Builder *this_01;
  Id IVar2;
  Scope value;
  mapped_type *pmVar3;
  Instruction *pIVar4;
  char *pcVar5;
  mapped_type_conflict *pmVar6;
  int t;
  long lVar7;
  allocator<char> local_f6;
  allocator<char> local_f5;
  Id local_f4;
  Instruction *type;
  Builder *local_e8;
  anon_class_8_1_8991fb9c findName;
  string debugName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  this_00 = &this->groupedTypes;
  lVar7 = 0;
  local_f4 = use;
  local_e8 = this;
  while( true ) {
    debugName._M_dataplus._M_p._0_4_ = 0x1168;
    pmVar3 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,(key_type *)&debugName);
    if ((int)((ulong)((long)(pmVar3->
                            super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                     (long)(pmVar3->
                           super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                           )._M_impl.super__Vector_impl_data._M_start) >> 3) <= lVar7) break;
    debugName._M_dataplus._M_p._0_4_ = 0x1168;
    pmVar3 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)this_00,(key_type *)&debugName);
    pIVar4 = (pmVar3->super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>).
             _M_impl.super__Vector_impl_data._M_start[lVar7];
    type = pIVar4;
    IVar2 = Instruction::getIdOperand(pIVar4,0);
    if (IVar2 == component) {
      IVar2 = Instruction::getIdOperand(pIVar4,1);
      if (IVar2 == scope) {
        IVar2 = Instruction::getIdOperand(pIVar4,2);
        if (IVar2 == rows) {
          IVar2 = Instruction::getIdOperand(pIVar4,3);
          if (IVar2 == cols) {
            IVar2 = Instruction::getIdOperand(pIVar4,4);
            if (IVar2 == local_f4) goto LAB_00359bb3;
          }
        }
      }
    }
    lVar7 = lVar7 + 1;
  }
  pIVar4 = (Instruction *)::operator_new(0x60);
  pBVar1 = local_e8;
  IVar2 = local_e8->uniqueId + 1;
  local_e8->uniqueId = IVar2;
  pIVar4->_vptr_Instruction = (_func_int **)&PTR__Instruction_0089f058;
  pIVar4->resultId = IVar2;
  pIVar4->typeId = 0;
  pIVar4->opCode = OpTypeCooperativeMatrixKHR;
  (pIVar4->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (pIVar4->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (pIVar4->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pIVar4->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pIVar4->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (pIVar4->operands).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pIVar4->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (pIVar4->idOperand).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  pIVar4->block = (Block *)0x0;
  type = pIVar4;
  Instruction::reserveOperands(pIVar4,5);
  Instruction::addIdOperand(pIVar4,component);
  Instruction::addIdOperand(pIVar4,scope);
  Instruction::addIdOperand(pIVar4,rows);
  Instruction::addIdOperand(pIVar4,cols);
  Instruction::addIdOperand(pIVar4,local_f4);
  debugName._M_dataplus._M_p._0_4_ = 0x1168;
  pmVar3 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)this_00,(key_type *)&debugName);
  std::vector<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>::push_back(pmVar3,&type);
  debugName._M_dataplus._M_p = (pointer)type;
  std::
  vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
  ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
            ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,std::allocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
              *)&pBVar1->constantsTypesGlobals,
             (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&debugName);
  if (debugName._M_dataplus._M_p != (pointer)0x0) {
    (**(code **)(*(long *)debugName._M_dataplus._M_p + 8))();
  }
  Module::mapInstruction(&pBVar1->module,type);
  this_01 = local_e8;
  if (pBVar1->emitNonSemanticShaderDebugInfo == true) {
    findName.this = local_e8;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&debugName,"coopmat<",(allocator<char> *)&local_b8);
    pcVar5 = makeCooperativeMatrixTypeKHR::anon_class_8_1_8991fb9c::operator()(&findName,component);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,pcVar5,(allocator<char> *)&local_90);
    std::operator+(&local_b8,&local_70,", ");
    std::__cxx11::string::append((string *)&debugName);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    if ((this_01->module).idToInstruction.
        super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
        super__Vector_impl_data._M_start[scope]->opCode == OpConstant) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"gl_Scope",&local_f5);
      value = getConstantScalar(this_01,scope);
      pcVar5 = ScopeToString(value);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,pcVar5,&local_f6);
      std::operator+(&local_70,&local_90,&local_50);
      std::operator+(&local_b8,&local_70,", ");
      std::__cxx11::string::append((string *)&debugName);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
    }
    else {
      pcVar5 = makeCooperativeMatrixTypeKHR::anon_class_8_1_8991fb9c::operator()(&findName,scope);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,pcVar5,(allocator<char> *)&local_90);
      std::operator+(&local_b8,&local_70,", ");
      std::__cxx11::string::append((string *)&debugName);
    }
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    pcVar5 = makeCooperativeMatrixTypeKHR::anon_class_8_1_8991fb9c::operator()(&findName,rows);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,pcVar5,(allocator<char> *)&local_90);
    std::operator+(&local_b8,&local_70,", ");
    std::__cxx11::string::append((string *)&debugName);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    pcVar5 = makeCooperativeMatrixTypeKHR::anon_class_8_1_8991fb9c::operator()(&findName,cols);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,pcVar5,(allocator<char> *)&local_90);
    std::operator+(&local_b8,&local_70,">");
    std::__cxx11::string::append((string *)&debugName);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    local_b8._M_dataplus._M_p = (pointer)0x0;
    local_b8._M_string_length = 0;
    local_b8.field_2._M_allocated_capacity = 0;
    IVar2 = makeCompositeDebugType
                      (this_01,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_b8,
                       debugName._M_dataplus._M_p,NonSemanticShaderDebugInfo100Structure,true);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_b8);
    local_b8._M_dataplus._M_p._0_4_ = type->resultId;
    pmVar6 = std::
             map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](&this_01->debugId,(key_type *)&local_b8);
    *pmVar6 = IVar2;
    std::__cxx11::string::_M_dispose();
  }
LAB_00359bb3:
  return type->resultId;
}

Assistant:

Id Builder::makeCooperativeMatrixTypeKHR(Id component, Id scope, Id rows, Id cols, Id use)
{
    // try to find it
    Instruction* type;
    for (int t = 0; t < (int)groupedTypes[OpTypeCooperativeMatrixKHR].size(); ++t) {
        type = groupedTypes[OpTypeCooperativeMatrixKHR][t];
        if (type->getIdOperand(0) == component &&
            type->getIdOperand(1) == scope &&
            type->getIdOperand(2) == rows &&
            type->getIdOperand(3) == cols &&
            type->getIdOperand(4) == use)
            return type->getResultId();
    }

    // not found, make it
    type = new Instruction(getUniqueId(), NoType, OpTypeCooperativeMatrixKHR);
    type->reserveOperands(5);
    type->addIdOperand(component);
    type->addIdOperand(scope);
    type->addIdOperand(rows);
    type->addIdOperand(cols);
    type->addIdOperand(use);
    groupedTypes[OpTypeCooperativeMatrixKHR].push_back(type);
    constantsTypesGlobals.push_back(std::unique_ptr<Instruction>(type));
    module.mapInstruction(type);

    if (emitNonSemanticShaderDebugInfo)
    {
        // Find a name for one of the parameters. It can either come from debuginfo for another
        // type, or an OpName from a constant.
        auto const findName = [&](Id id) {
            Id id2 = debugId[id];
            for (auto &t : groupedDebugTypes[NonSemanticShaderDebugInfo100DebugTypeBasic]) {
                if (t->getResultId() == id2) {
                    for (auto &s : strings) {
                        if (s->getResultId() == t->getIdOperand(2)) {
                            return s->getNameString();
                        }
                    }
                }
            }
            for (auto &t : names) {
                if (t->getIdOperand(0) == id) {
                    return t->getNameString();
                }
            }
            return "unknown";
        };
        std::string debugName = "coopmat<";
        debugName += std::string(findName(component)) + ", ";
        if (isConstantScalar(scope)) {
            debugName += std::string("gl_Scope") + std::string(spv::ScopeToString((spv::Scope)getConstantScalar(scope))) + ", ";
        } else {
            debugName += std::string(findName(scope)) + ", ";
        }
        debugName += std::string(findName(rows)) + ", ";
        debugName += std::string(findName(cols)) + ">";
        // There's no nonsemantic debug info instruction for cooperative matrix types,
        // use opaque composite instead.
        auto const debugResultId = makeCompositeDebugType({}, debugName.c_str(), NonSemanticShaderDebugInfo100Structure, true);
        debugId[type->getResultId()] = debugResultId;
    }

    return type->getResultId();
}